

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O1

void msd_D_adaptive<vector_malloc<unsigned_char*,16u>>
               (uchar **strings,size_t n,size_t depth,vector_malloc<unsigned_char_*,_16U> *buckets)

{
  vector_malloc<unsigned_char_*,_16U> *pvVar1;
  undefined8 *puVar2;
  uchar *puVar3;
  size_t sVar4;
  long lVar5;
  size_t j;
  long *__ptr;
  long lVar6;
  ulong uVar7;
  size_t *psVar8;
  ushort uVar9;
  uint i;
  size_t j_1;
  size_t sVar10;
  long lVar11;
  uchar **ppuVar12;
  uint16_t cache [16];
  ushort auStack_58 [20];
  
  if (n < 0x10000) {
    msd_D<vector_malloc<unsigned_char*,16u>,unsigned_short>(strings,n,depth,buckets);
    return;
  }
  __ptr = (long *)malloc(0x80000);
  if ((n & 0xfffffffffffffff0) == 0) {
    sVar10 = 0;
  }
  else {
    sVar10 = 0;
    ppuVar12 = strings;
    do {
      lVar6 = 0;
      do {
        puVar3 = ppuVar12[lVar6];
        if (puVar3 == (uchar *)0x0) goto LAB_00196ee0;
        if (puVar3[depth] == '\0') {
          uVar9 = 0;
        }
        else {
          uVar9 = CONCAT11(puVar3[depth],puVar3[depth + 1]);
        }
        auStack_58[lVar6] = uVar9;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x10);
      lVar6 = 0;
      do {
        pvVar1 = buckets + auStack_58[lVar6];
        if (pvVar1->_size == pvVar1->_capacity) {
          vector_malloc<unsigned_char_*,_16U>::grow(pvVar1);
        }
        sVar4 = pvVar1->_size;
        pvVar1->_data[sVar4] = ppuVar12[lVar6];
        pvVar1->_size = sVar4 + 1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x10);
      sVar10 = sVar10 + 0x10;
      ppuVar12 = ppuVar12 + 0x10;
    } while (sVar10 < (n & 0xfffffffffffffff0));
  }
  if (sVar10 < n) {
    do {
      puVar3 = strings[sVar10];
      if (puVar3 == (uchar *)0x0) {
LAB_00196ee0:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar3[depth] == '\0') {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)CONCAT11(puVar3[depth],puVar3[depth + 1]);
      }
      pvVar1 = buckets + uVar7;
      if (pvVar1->_size == pvVar1->_capacity) {
        vector_malloc<unsigned_char_*,_16U>::grow(pvVar1);
      }
      sVar4 = pvVar1->_size;
      pvVar1->_data[sVar4] = strings[sVar10];
      pvVar1->_size = sVar4 + 1;
      sVar10 = sVar10 + 1;
    } while (n != sVar10);
  }
  psVar8 = &buckets->_size;
  lVar6 = 0;
  do {
    __ptr[lVar6] = *psVar8;
    lVar6 = lVar6 + 1;
    psVar8 = psVar8 + 3;
  } while (lVar6 != 0x10000);
  psVar8 = &buckets->_size;
  lVar11 = 0;
  lVar6 = 0;
  do {
    lVar5 = __ptr[lVar11];
    if (lVar5 != 0) {
      if (*psVar8 != 0) {
        memmove(strings + lVar6,((vector_malloc<unsigned_char_*,_16U> *)(psVar8 + -1))->_data,
                *psVar8 << 3);
      }
      lVar6 = lVar6 + lVar5;
    }
    lVar11 = lVar11 + 1;
    psVar8 = psVar8 + 3;
  } while (lVar11 != 0x10000);
  lVar6 = 0;
  do {
    free(*(void **)((long)&buckets->_data + lVar6));
    puVar2 = (undefined8 *)((long)&buckets->_data + lVar6);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined8 *)((long)&buckets->_capacity + lVar6) = 0;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x180000);
  lVar6 = *__ptr;
  lVar11 = 1;
  do {
    sVar10 = __ptr[lVar11];
    if (sVar10 != 0) {
      if ((char)lVar11 != '\0') {
        msd_D_adaptive<vector_malloc<unsigned_char*,16u>>(strings + lVar6,sVar10,depth + 2,buckets);
      }
      lVar6 = lVar6 + sVar10;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x10000);
  free(__ptr);
  return;
}

Assistant:

static void
msd_D_adaptive(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 0x10000) {
		msd_D<Bucket, uint16_t>(strings, n, depth, buckets);
		return;
	}
	size_t* bucketsize = (size_t*) malloc(0x10000 * sizeof(size_t));
	size_t i=0;
	for (; i < n-n%16; i+=16) {
		uint16_t cache[16];
		for (size_t j=0; j < 16; ++j) {
			cache[j] = get_char<uint16_t>(strings[i+j], depth);
		}
		for (size_t j=0; j < 16; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		const uint16_t ch = get_char<uint16_t>(strings[i], depth);
		buckets[ch].push_back(strings[i]);
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_D_adaptive(
				strings+pos, bucketsize[i],
				depth+2, buckets);
		pos += bucketsize[i];
	}
	free(bucketsize);
}